

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O0

bool __thiscall
draco::KdTreeAttributesDecoder::DecodePortableAttributes
          (KdTreeAttributesDecoder *this,DecoderBuffer *in_buffer)

{
  bool bVar1;
  byte bVar2;
  uint16_t uVar3;
  int iVar4;
  DataType DVar5;
  PointCloudDecoder *pPVar6;
  PointCloud *this_00;
  DecoderBuffer *in_RSI;
  long *in_RDI;
  OutIt out_it;
  uint32_t num_components;
  uint32_t data_size;
  DataType data_type;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> port_att;
  GeometryAttribute va;
  int num_components_1;
  int c;
  PointAttribute *target_att;
  PointAttribute *att;
  int att_id;
  int i;
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  atts;
  uint32_t total_dimensionality;
  int num_attributes;
  int32_t num_points;
  uint8_t compression_level;
  PointAttributeVectorOutputIterator<unsigned_int> *in_stack_00000230;
  DecoderBuffer *in_stack_00000238;
  int in_stack_00000240;
  int in_stack_00000244;
  KdTreeAttributesDecoder *in_stack_00000248;
  pointer in_stack_fffffffffffffe08;
  PointCloud *in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe19;
  undefined1 in_stack_fffffffffffffe1a;
  undefined1 in_stack_fffffffffffffe1b;
  undefined1 in_stack_fffffffffffffe1c;
  undefined1 in_stack_fffffffffffffe1d;
  undefined1 in_stack_fffffffffffffe1e;
  uint8_t in_stack_fffffffffffffe1f;
  DataBuffer *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  Type in_stack_fffffffffffffe2c;
  PointAttribute *in_stack_fffffffffffffe30;
  undefined1 *in_stack_fffffffffffffe40;
  PointAttribute *in_stack_fffffffffffffe48;
  int32_t in_stack_fffffffffffffe58;
  Type in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  DataType in_stack_fffffffffffffe64;
  int32_t local_dc;
  int local_d8;
  int local_d4;
  DataType in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  DecoderBuffer *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  KdTreeAttributesDecoder *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  KdTreeAttributesDecoder *in_stack_ffffffffffffff58;
  int local_74;
  PointAttribute *local_70;
  int local_58;
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  local_40;
  int local_28;
  undefined4 local_24;
  ValueType local_20;
  byte local_19;
  byte local_1;
  
  uVar3 = DecoderBuffer::bitstream_version(in_RSI);
  if (uVar3 < 0x203) {
    local_1 = 1;
    goto LAB_001ec30f;
  }
  local_19 = 0;
  bVar1 = DecoderBuffer::Decode<unsigned_char>
                    ((DecoderBuffer *)
                     CONCAT17(in_stack_fffffffffffffe1f,
                              CONCAT16(in_stack_fffffffffffffe1e,
                                       CONCAT15(in_stack_fffffffffffffe1d,
                                                CONCAT14(in_stack_fffffffffffffe1c,
                                                         CONCAT13(in_stack_fffffffffffffe1b,
                                                                  CONCAT12(in_stack_fffffffffffffe1a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffe19,
                                                  in_stack_fffffffffffffe18))))))),
                     (uchar *)in_stack_fffffffffffffe10);
  if (!bVar1) {
    local_1 = 0;
    goto LAB_001ec30f;
  }
  pPVar6 = (PointCloudDecoder *)(**(code **)(*in_RDI + 0x38))();
  this_00 = PointCloudDecoder::point_cloud(pPVar6);
  local_20 = PointCloud::num_points(this_00);
  local_24 = (**(code **)(*in_RDI + 0x30))();
  local_28 = 0;
  std::
  allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>
  ::allocator((allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>
               *)0x1eba39);
  std::
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
            *)in_stack_fffffffffffffe30,
           CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
           (allocator_type *)in_stack_fffffffffffffe20);
  std::
  allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>
  ::~allocator((allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>
                *)0x1eba65);
  for (local_58 = 0; iVar4 = (**(code **)(*in_RDI + 0x30))(), local_58 < iVar4;
      local_58 = local_58 + 1) {
    (**(code **)(*in_RDI + 0x28))(in_RDI,local_58);
    pPVar6 = (PointCloudDecoder *)(**(code **)(*in_RDI + 0x38))();
    PointCloudDecoder::point_cloud(pPVar6);
    local_70 = PointCloud::attribute
                         (in_stack_fffffffffffffe10,
                          (int32_t)((ulong)in_stack_fffffffffffffe08 >> 0x20));
    PointAttribute::Reset(in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
    PointAttribute::SetIdentityMapping((PointAttribute *)0x1ebb61);
    DVar5 = GeometryAttribute::data_type(&local_70->super_GeometryAttribute);
    if (((DVar5 != DT_UINT32) &&
        (DVar5 = GeometryAttribute::data_type(&local_70->super_GeometryAttribute),
        DVar5 != DT_UINT16)) &&
       (DVar5 = GeometryAttribute::data_type(&local_70->super_GeometryAttribute), DVar5 != DT_UINT8)
       ) {
      DVar5 = GeometryAttribute::data_type(&local_70->super_GeometryAttribute);
      if (((DVar5 == DT_INT32) ||
          (DVar5 = GeometryAttribute::data_type(&local_70->super_GeometryAttribute),
          DVar5 == DT_INT16)) ||
         (DVar5 = GeometryAttribute::data_type(&local_70->super_GeometryAttribute), DVar5 == DT_INT8
         )) {
        for (local_74 = 0;
            bVar2 = GeometryAttribute::num_components(&local_70->super_GeometryAttribute),
            local_74 < (int)(uint)bVar2; local_74 = local_74 + 1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe10,
                     (value_type_conflict1 *)in_stack_fffffffffffffe08);
        }
      }
      else {
        in_stack_fffffffffffffe64 = GeometryAttribute::data_type(&local_70->super_GeometryAttribute)
        ;
        if (in_stack_fffffffffffffe64 != DT_FLOAT32) {
          local_1 = 0;
          goto LAB_001ec2f1;
        }
        bVar2 = GeometryAttribute::num_components(&local_70->super_GeometryAttribute);
        in_stack_fffffffffffffe60 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe60);
        GeometryAttribute::GeometryAttribute((GeometryAttribute *)in_stack_fffffffffffffe10);
        in_stack_fffffffffffffe5c =
             GeometryAttribute::attribute_type(&local_70->super_GeometryAttribute);
        in_stack_fffffffffffffe58 = DataTypeLength(DT_UINT32);
        in_stack_fffffffffffffe08 = (pointer)(long)(int)((uint)bVar2 * in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe10 = (PointCloud *)0x0;
        GeometryAttribute::Init
                  (&in_stack_fffffffffffffe30->super_GeometryAttribute,in_stack_fffffffffffffe2c,
                   in_stack_fffffffffffffe20,in_stack_fffffffffffffe1f,
                   CONCAT13(in_stack_fffffffffffffe1b,
                            CONCAT12(in_stack_fffffffffffffe1a,
                                     CONCAT11(in_stack_fffffffffffffe19,in_stack_fffffffffffffe18)))
                   ,false,(int64_t)in_stack_fffffffffffffe40,(int64_t)in_stack_fffffffffffffe48);
        in_stack_fffffffffffffe48 = (PointAttribute *)operator_new(0x70);
        PointAttribute::PointAttribute
                  (in_stack_fffffffffffffe30,
                   (GeometryAttribute *)
                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        in_stack_fffffffffffffe40 = &stack0xffffffffffffff38;
        std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>::
        unique_ptr<std::default_delete<draco::PointAttribute>,void>
                  ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *
                   )in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
        operator->((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *
                   )0x1ebe01);
        PointAttribute::SetIdentityMapping((PointAttribute *)0x1ebe09);
        std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
        operator->((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *
                   )0x1ebe18);
        PointAttribute::Reset(in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
        std::
        vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
        ::push_back((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                     *)in_stack_fffffffffffffe10,(value_type *)in_stack_fffffffffffffe08);
        std::
        vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
        ::back((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                *)in_stack_fffffffffffffe10);
        local_70 = std::
                   unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
                   get((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                        *)in_stack_fffffffffffffe10);
        std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
        ~unique_ptr((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                     *)in_stack_fffffffffffffe20);
      }
    }
    in_stack_ffffffffffffff30 = GeometryAttribute::data_type(&local_70->super_GeometryAttribute);
    local_d8 = 0;
    local_dc = DataTypeLength(in_stack_ffffffffffffff30);
    in_stack_fffffffffffffe30 = (PointAttribute *)std::max<int>(&local_d8,&local_dc);
    local_d4 = *(int *)&(((_Vector_impl *)
                         &(in_stack_fffffffffffffe30->super_GeometryAttribute).buffer_)->
                        super__Vector_impl_data)._M_start;
    bVar2 = GeometryAttribute::num_components(&local_70->super_GeometryAttribute);
    in_stack_fffffffffffffe2c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe2c);
    std::
    make_tuple<draco::PointAttribute*&,unsigned_int&,draco::DataType_const&,unsigned_int_const&,unsigned_int_const&>
              ((PointAttribute **)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (uint *)in_stack_fffffffffffffe20,
               (DataType *)
               CONCAT17(in_stack_fffffffffffffe1f,
                        CONCAT16(in_stack_fffffffffffffe1e,
                                 CONCAT15(in_stack_fffffffffffffe1d,
                                          CONCAT14(in_stack_fffffffffffffe1c,
                                                   CONCAT13(in_stack_fffffffffffffe1b,
                                                            CONCAT12(in_stack_fffffffffffffe1a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffe19,
                                                  in_stack_fffffffffffffe18))))))),
               (uint *)in_stack_fffffffffffffe10,(uint *)in_stack_fffffffffffffe08);
    std::
    vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
    ::operator[](&local_40,(long)local_58);
    std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>::
    operator=((tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
               *)in_stack_fffffffffffffe10,(type)in_stack_fffffffffffffe08);
    local_28 = (uint)bVar2 + local_28;
  }
  PointAttributeVectorOutputIterator<unsigned_int>::PointAttributeVectorOutputIterator
            ((PointAttributeVectorOutputIterator<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
              *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  in_stack_fffffffffffffe20 = (DataBuffer *)(ulong)local_19;
  switch(in_stack_fffffffffffffe20) {
  case (DataBuffer *)0x0:
    bVar1 = DecodePoints<0,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                       ,(DecoderBuffer *)in_stack_ffffffffffffff48,
                       (PointAttributeVectorOutputIterator<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if (bVar1) {
LAB_001ec2d1:
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
    break;
  case (DataBuffer *)0x1:
    bVar1 = DecodePoints<1,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                       ,(DecoderBuffer *)in_stack_ffffffffffffff48,
                       (PointAttributeVectorOutputIterator<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if (bVar1) goto LAB_001ec2d1;
    local_1 = 0;
    break;
  case (DataBuffer *)0x2:
    bVar1 = DecodePoints<2,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                       ,in_stack_ffffffffffffff38,
                       (PointAttributeVectorOutputIterator<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    if (bVar1) goto LAB_001ec2d1;
    local_1 = 0;
    break;
  case (DataBuffer *)0x3:
    bVar1 = DecodePoints<3,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                       ,in_stack_ffffffffffffff38,
                       (PointAttributeVectorOutputIterator<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    if (bVar1) goto LAB_001ec2d1;
    local_1 = 0;
    break;
  case (DataBuffer *)0x4:
    bVar1 = DecodePoints<4,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (in_stack_00000248,in_stack_00000244,in_stack_00000240,in_stack_00000238,
                       in_stack_00000230);
    if (bVar1) goto LAB_001ec2d1;
    local_1 = 0;
    break;
  case (DataBuffer *)0x5:
    bVar1 = DecodePoints<5,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (in_stack_00000248,in_stack_00000244,in_stack_00000240,in_stack_00000238,
                       in_stack_00000230);
    if (bVar1) goto LAB_001ec2d1;
    local_1 = 0;
    break;
  case (DataBuffer *)0x6:
    bVar1 = DecodePoints<6,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (in_stack_00000248,in_stack_00000244,in_stack_00000240,in_stack_00000238,
                       in_stack_00000230);
    if (bVar1) goto LAB_001ec2d1;
    local_1 = 0;
    break;
  default:
    local_1 = 0;
  }
  PointAttributeVectorOutputIterator<unsigned_int>::~PointAttributeVectorOutputIterator
            ((PointAttributeVectorOutputIterator<unsigned_int> *)in_stack_fffffffffffffe10);
LAB_001ec2f1:
  std::
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
             *)in_stack_fffffffffffffe20);
LAB_001ec30f:
  return (bool)(local_1 & 1);
}

Assistant:

bool KdTreeAttributesDecoder::DecodePortableAttributes(
    DecoderBuffer *in_buffer) {
  if (in_buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 3)) {
    // Old bitstream does everything in the
    // DecodeDataNeededByPortableTransforms() method.
    return true;
  }
  uint8_t compression_level = 0;
  if (!in_buffer->Decode(&compression_level)) {
    return false;
  }
  const int32_t num_points = GetDecoder()->point_cloud()->num_points();

  // Decode data using the kd tree decoding into integer (portable) attributes.
  // We first need to go over all attributes and create a new portable storage
  // for those attributes that need it (floating point attributes that have to
  // be dequantized after decoding).

  const int num_attributes = GetNumAttributes();
  uint32_t total_dimensionality = 0;  // position is a required dimension
  std::vector<AttributeTuple> atts(num_attributes);

  for (int i = 0; i < GetNumAttributes(); ++i) {
    const int att_id = GetAttributeId(i);
    PointAttribute *const att = GetDecoder()->point_cloud()->attribute(att_id);
    // All attributes have the same number of values and identity mapping
    // between PointIndex and AttributeValueIndex.
    att->Reset(num_points);
    att->SetIdentityMapping();

    PointAttribute *target_att = nullptr;
    if (att->data_type() == DT_UINT32 || att->data_type() == DT_UINT16 ||
        att->data_type() == DT_UINT8) {
      // We can decode to these attributes directly.
      target_att = att;
    } else if (att->data_type() == DT_INT32 || att->data_type() == DT_INT16 ||
               att->data_type() == DT_INT8) {
      // Prepare storage for data that is used to convert unsigned values back
      // to the signed ones.
      for (int c = 0; c < att->num_components(); ++c) {
        min_signed_values_.push_back(0);
      }
      target_att = att;
    } else if (att->data_type() == DT_FLOAT32) {
      // Create a portable attribute that will hold the decoded data. We will
      // dequantize the decoded data to the final attribute later on.
      const int num_components = att->num_components();
      GeometryAttribute va;
      va.Init(att->attribute_type(), nullptr, num_components, DT_UINT32, false,
              num_components * DataTypeLength(DT_UINT32), 0);
      std::unique_ptr<PointAttribute> port_att(new PointAttribute(va));
      port_att->SetIdentityMapping();
      port_att->Reset(num_points);
      quantized_portable_attributes_.push_back(std::move(port_att));
      target_att = quantized_portable_attributes_.back().get();
    } else {
      // Unsupported type.
      return false;
    }
    // Add attribute to the output iterator used by the core algorithm.
    const DataType data_type = target_att->data_type();
    const uint32_t data_size = (std::max)(0, DataTypeLength(data_type));
    const uint32_t num_components = target_att->num_components();
    atts[i] = std::make_tuple(target_att, total_dimensionality, data_type,
                              data_size, num_components);
    total_dimensionality += num_components;
  }
  typedef PointAttributeVectorOutputIterator<uint32_t> OutIt;
  OutIt out_it(atts);

  switch (compression_level) {
    case 0: {
      if (!DecodePoints<0, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 1: {
      if (!DecodePoints<1, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 2: {
      if (!DecodePoints<2, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 3: {
      if (!DecodePoints<3, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 4: {
      if (!DecodePoints<4, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 5: {
      if (!DecodePoints<5, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 6: {
      if (!DecodePoints<6, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    default:
      return false;
  }
  return true;
}